

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_dynamic_suite::dynamic_last_segment(void)

{
  initializer_list<int> input;
  segment sVar1;
  _Vector_base<int,_std::allocator<int>_> local_68;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x160000000b;
  input._M_len = 2;
  input._M_array = (iterator)&local_68;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&span);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x217,"void api_dynamic_suite::dynamic_last_segment()",sVar1.member.head,
             sVar1.member.tail,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void dynamic_last_segment()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22 };
    auto segment = span.last_segment();
    {
        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}